

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_Hate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  uint uVar1;
  AActor *pAVar2;
  bool bVar3;
  TFlags<ActorFlag,_unsigned_int> local_8c;
  TFlags<ActorFlag2,_unsigned_int> local_88;
  TFlags<ActorFlag2,_unsigned_int> local_84;
  TFlags<ActorFlag,_unsigned_int> local_80;
  Self local_7c;
  Self local_78;
  Self local_74;
  TFlags<ActorFlag,_unsigned_int> local_70;
  TFlags<ActorFlag2,_unsigned_int> local_6c;
  TFlags<ActorFlag,_unsigned_int> local_68;
  byte local_61;
  undefined1 local_60 [7];
  bool nothingToHate;
  FActorIterator hateeIt;
  AActor *hatee;
  AActor *hater;
  FActorIterator haterIt;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  haterIt.id = arg2;
  haterIt._12_4_ = arg1;
  FActorIterator::FActorIterator((FActorIterator *)&hater,arg0);
  hateeIt.id = 0;
  hateeIt._12_4_ = 0;
  FActorIterator::FActorIterator((FActorIterator *)local_60,haterIt._12_4_);
  local_61 = 0;
  if (haterIt._12_4_ != 0) {
    do {
      hateeIt._8_8_ = FActorIterator::Next((FActorIterator *)local_60);
      if ((AActor *)hateeIt._8_8_ == (AActor *)0x0) break;
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_68,
                 (int)hateeIt._8_8_ + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_68);
      bVar3 = false;
      if ((uVar1 != 0) && (bVar3 = false, 0 < *(int *)(hateeIt._8_8_ + 0x1cc))) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_6c,hateeIt.id + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_6c);
        bVar3 = uVar1 == 0;
      }
    } while (!bVar3);
    if (hateeIt._8_8_ == 0) {
      local_61 = 1;
    }
  }
  if (arg0 == 0) {
    hatee = it;
    if ((it != (AActor *)0x0) && (it->player != (player_t *)0x0)) {
      return 0;
    }
  }
  else {
    do {
      hatee = FActorIterator::Next((FActorIterator *)&hater);
      if (hatee == (AActor *)0x0) break;
      bVar3 = false;
      if (0 < hatee->health) {
        TFlags<ActorFlag,_unsigned_int>::operator&
                  (&local_70,(int)hatee + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE)
                  );
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_70);
        bVar3 = uVar1 != 0;
      }
    } while (!bVar3);
  }
  do {
    if (hatee == (AActor *)0x0) {
      return 1;
    }
    if (hatee->SeeState != (FState *)0x0) {
      if (haterIt.id != 0) {
        hatee->TIDtoHate = haterIt._12_4_;
        TObjPtr<AActor>::operator=(&hatee->LastLookActor,(AActor *)0x0);
        if (haterIt._12_4_ != 0) {
          bVar3 = TObjPtr<AActor>::operator!=(&hatee->target,(AActor *)0x0);
          if ((bVar3) &&
             (pAVar2 = TObjPtr<AActor>::operator->(&hatee->target), pAVar2->tid != haterIt._12_4_))
          {
            TObjPtr<AActor>::operator=(&hatee->target,(AActor *)0x0);
          }
          bVar3 = TObjPtr<AActor>::operator!=(&hatee->lastenemy,(AActor *)0x0);
          if ((bVar3) &&
             (pAVar2 = TObjPtr<AActor>::operator->(&hatee->lastenemy), pAVar2->tid != haterIt._12_4_
             )) {
            TObjPtr<AActor>::operator=(&hatee->lastenemy,(AActor *)0x0);
          }
        }
      }
      if (((haterIt.id == 2) || (haterIt.id == 4)) || (haterIt.id == 6)) {
        TFlags<ActorFlag3,_unsigned_int>::operator|=(&hatee->flags3,MF3_NOSIGHTCHECK);
      }
      else {
        operator~((EnumType)&local_74);
        TFlags<ActorFlag3,_unsigned_int>::operator&=(&hatee->flags3,&local_74);
      }
      if ((haterIt.id == 3) || (haterIt.id == 4)) {
        TFlags<ActorFlag3,_unsigned_int>::operator|=(&hatee->flags3,MF3_HUNTPLAYERS);
      }
      else {
        operator~((EnumType)&local_78);
        TFlags<ActorFlag3,_unsigned_int>::operator&=(&hatee->flags3,&local_78);
      }
      if ((haterIt.id == 5) || (haterIt.id == 6)) {
        TFlags<ActorFlag4,_unsigned_int>::operator|=(&hatee->flags4,MF4_NOHATEPLAYERS);
      }
      else {
        operator~((EnumType)&local_7c);
        TFlags<ActorFlag4,_unsigned_int>::operator&=(&hatee->flags4,&local_7c);
      }
      pAVar2 = it;
      if (haterIt._12_4_ != 0) {
        if ((local_61 & 1) == 0) {
          pAVar2 = (AActor *)hateeIt._8_8_;
          if (haterIt.id != 0) {
            do {
              hateeIt._8_8_ = FActorIterator::Next((FActorIterator *)local_60);
              bVar3 = true;
              if (((AActor *)hateeIt._8_8_ != (AActor *)0x0) &&
                 (bVar3 = true, (AActor *)hateeIt._8_8_ != hatee)) {
                TFlags<ActorFlag,_unsigned_int>::operator&
                          (&local_80,
                           (int)hateeIt._8_8_ +
                           (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
                uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_80);
                bVar3 = true;
                if ((uVar1 != 0) && (bVar3 = true, 0 < *(int *)(hateeIt._8_8_ + 0x1cc))) {
                  TFlags<ActorFlag2,_unsigned_int>::operator&
                            (&local_84,hateeIt.id + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
                  uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_84);
                  bVar3 = uVar1 != 0;
                }
              }
              pAVar2 = (AActor *)hateeIt._8_8_;
            } while (bVar3);
          }
        }
        else {
          hateeIt.id = 0;
          hateeIt._12_4_ = 0;
          pAVar2 = (AActor *)hateeIt._8_8_;
        }
      }
      hateeIt._8_8_ = pAVar2;
      if ((hateeIt._8_8_ != 0) && ((AActor *)hateeIt._8_8_ != hatee)) {
        if (haterIt.id == 0) {
LAB_00664ff3:
          pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&hatee->target);
          if (pAVar2 != (AActor *)0x0) {
            (hatee->lastenemy).field_0 = (hatee->target).field_0;
          }
          TObjPtr<AActor>::operator=(&hatee->target,(AActor *)hateeIt._8_8_);
          TFlags<ActorFlag2,_unsigned_int>::operator&
                    (&local_88,(int)hatee + (MF2_RIP|MF2_NOTELEPORT|MF2_FLY));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_88);
          if ((uVar1 == 0) && (0 < hatee->health)) {
            AActor::SetState(hatee,hatee->SeeState,false);
          }
        }
        else {
          bVar3 = TObjPtr<AActor>::operator!=(&hatee->goal,(AActor *)0x0);
          if (bVar3) {
            pAVar2 = TObjPtr::operator_cast_to_AActor_((TObjPtr *)&hatee->goal);
            bVar3 = TObjPtr<AActor>::operator!=(&hatee->target,pAVar2);
            if (bVar3) goto LAB_00664ff3;
          }
        }
      }
    }
    if (arg0 == 0) {
      hatee = (AActor *)0x0;
    }
    else {
      do {
        hatee = FActorIterator::Next((FActorIterator *)&hater);
        if (hatee == (AActor *)0x0) break;
        bVar3 = false;
        if (0 < hatee->health) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_8c,
                     (int)hatee + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_8c);
          bVar3 = uVar1 != 0;
        }
      } while (!bVar3);
    }
  } while( true );
}

Assistant:

FUNC(LS_Thing_Hate)
// Thing_Hate (hater, hatee, group/"xray"?)
{
	FActorIterator haterIt (arg0);
	AActor *hater, *hatee = NULL;
	FActorIterator hateeIt (arg1);
	bool nothingToHate = false;

	if (arg1 != 0)
	{
		while ((hatee = hateeIt.Next ()))
		{
			if (hatee->flags & MF_SHOOTABLE	&&	// can't hate nonshootable things
				hatee->health > 0 &&			// can't hate dead things
				!(hatee->flags2 & MF2_DORMANT))	// can't target dormant things
			{
				break;
			}
		}
		if (hatee == NULL)
		{ // Nothing to hate
			nothingToHate = true;
		}
	}

	if (arg0 == 0)
	{
		if (it != NULL && it->player != NULL)
		{
			// Players cannot have their attitudes set
			return false;
		}
		else
		{
			hater = it;
		}
	}
	else
	{
		while ((hater = haterIt.Next ()))
		{
			if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
			{
				break;
			}
		}
	}
	while (hater != NULL)
	{
		// Can't hate if can't attack.
		if (hater->SeeState != NULL)
		{
			// If hating a group of things, record the TID and NULL
			// the target (if its TID doesn't match). A_Look will
			// find an appropriate thing to go chase after.
			if (arg2 != 0)
			{
				hater->TIDtoHate = arg1;
				hater->LastLookActor = NULL;

				// If the TID to hate is 0, then don't forget the target and
				// lastenemy fields.
				if (arg1 != 0)
				{
					if (hater->target != NULL && hater->target->tid != arg1)
					{
						hater->target = NULL;
					}
					if (hater->lastenemy != NULL && hater->lastenemy->tid != arg1)
					{
						hater->lastenemy = NULL;
					}
				}
			}
			// Hate types for arg2:
			//
			// 0 - Just hate one specific actor
			// 1 - Hate actors with given TID and attack players when shot
			// 2 - Same as 1, but will go after enemies without seeing them first
			// 3 - Hunt actors with given TID and also players
			// 4 - Same as 3, but will go after monsters without seeing them first
			// 5 - Hate actors with given TID and ignore player attacks
			// 6 - Same as 5, but will go after enemies without seeing them first

			// Note here: If you use Thing_Hate (tid, 0, 2), you can make
			// a monster go after a player without seeing him first.
			if (arg2 == 2 || arg2 == 4 || arg2 == 6)
			{
				hater->flags3 |= MF3_NOSIGHTCHECK;
			}
			else
			{
				hater->flags3 &= ~MF3_NOSIGHTCHECK;
			}
			if (arg2 == 3 || arg2 == 4)
			{
				hater->flags3 |= MF3_HUNTPLAYERS;
			}
			else
			{
				hater->flags3 &= ~MF3_HUNTPLAYERS;
			}
			if (arg2 == 5 || arg2 == 6)
			{
				hater->flags4 |= MF4_NOHATEPLAYERS;
			}
			else
			{
				hater->flags4 &= ~MF4_NOHATEPLAYERS;
			}

			if (arg1 == 0)
			{
				hatee = it;
			}
			else if (nothingToHate)
			{
				hatee = NULL;
			}
			else if (arg2 != 0)
			{
				do
				{
					hatee = hateeIt.Next ();
				}
				while ( hatee == NULL ||
						hatee == hater ||					// can't hate self
						!(hatee->flags & MF_SHOOTABLE) ||	// can't hate nonshootable things
						hatee->health <= 0 ||				// can't hate dead things
						(hatee->flags2 & MF2_DORMANT));	
			}

			if (hatee != NULL && hatee != hater && (arg2 == 0 || (hater->goal != NULL && hater->target != hater->goal)))
			{
				if (hater->target)
				{
					hater->lastenemy = hater->target;
				}
				hater->target = hatee;
				if (!(hater->flags2 & MF2_DORMANT))
				{
					if (hater->health > 0) hater->SetState (hater->SeeState);
				}
			}
		}
		if (arg0 != 0)
		{
			while ((hater = haterIt.Next ()))
			{
				if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
				{
					break;
				}
			}
		}
		else
		{
			hater = NULL;
		}
	}
	return true;
}